

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

int decompress_smooth_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  jpeg_d_coef_controller *pjVar8;
  JBLOCKROW output_row;
  _func_JBLOCKARRAY_j_common_ptr_jvirt_barray_ptr_JDIMENSION_JDIMENSION_boolean *p_Var9;
  _func_int_j_decompress_ptr_JSAMPIMAGE *p_Var10;
  JQUANT_TBL *pJVar11;
  inverse_DCT_method_ptr p_Var12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  JCOEF JVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  jpeg_decomp_master *pjVar48;
  long lVar49;
  uint uVar50;
  ulong uVar51;
  int iVar52;
  int iVar53;
  JBLOCKROW paJVar54;
  ulong uVar55;
  int iVar56;
  int iVar57;
  JDIMENSION JVar58;
  int iVar59;
  int iVar60;
  long lVar61;
  int iVar62;
  long lVar63;
  int iVar64;
  int iVar65;
  ulong uVar66;
  ulong uVar67;
  JBLOCKROW paJVar68;
  uint uVar69;
  uint uVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  bool bVar75;
  int local_25c;
  jpeg_component_info *local_248;
  int local_23c;
  JBLOCKARRAY local_1d8;
  JBLOCKROW local_1d0;
  JBLOCKROW local_1c8;
  JBLOCKROW local_1c0;
  JSAMPARRAY local_170;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  
  pjVar8 = cinfo->coef;
  JVar58 = cinfo->total_iMCU_rows;
  uVar44 = JVar58 - 1;
  output_row = (JBLOCKROW)pjVar8[3].start_output_pass;
  while( true ) {
    if (((cinfo->output_scan_number < cinfo->input_scan_number) ||
        (cinfo->inputctl->eoi_reached != 0)) ||
       ((cinfo->input_scan_number == cinfo->output_scan_number &&
        ((uint)(cinfo->Ss == 0) * 2 + cinfo->output_iMCU_row < cinfo->input_iMCU_row)))) break;
    iVar45 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar45 == 0) {
      return 0;
    }
  }
  local_248 = cinfo->comp_info;
  uVar46 = JVar58 - 2;
  local_140 = 0;
  local_148 = 0;
  local_150 = 0;
  local_158 = 0;
  for (lVar61 = 0; lVar61 < cinfo->num_components; lVar61 = lVar61 + 1) {
    if (local_248->component_needed != 0) {
      uVar6 = cinfo->output_iMCU_row;
      if (uVar6 < uVar46) {
        uVar50 = local_248->v_samp_factor;
        JVar58 = uVar50 * 3;
        uVar70 = uVar50;
      }
      else if (uVar6 < uVar44) {
        uVar50 = local_248->v_samp_factor;
        JVar58 = uVar50 * 2;
        uVar70 = uVar50;
      }
      else {
        uVar50 = local_248->v_samp_factor;
        JVar58 = local_248->height_in_blocks % uVar50;
        uVar70 = JVar58;
        if (JVar58 == 0) {
          JVar58 = uVar50;
          uVar70 = uVar50;
        }
      }
      if (uVar6 < 2) {
        p_Var9 = cinfo->mem->access_virt_barray;
        if (uVar6 == 1) {
          local_1d8 = (*p_Var9)((j_common_ptr)cinfo,
                                (jvirt_barray_ptr)(&pjVar8[3].decompress_data)[lVar61],0,JVar58,0);
          local_1d8 = local_1d8 + local_248->v_samp_factor;
        }
        else {
          local_1d8 = (*p_Var9)((j_common_ptr)cinfo,
                                (jvirt_barray_ptr)(&pjVar8[3].decompress_data)[lVar61],0,JVar58,0);
        }
      }
      else {
        local_1d8 = (*cinfo->mem->access_virt_barray)
                              ((j_common_ptr)cinfo,
                               (jvirt_barray_ptr)(&pjVar8[3].decompress_data)[lVar61],
                               (uVar6 - 2) * uVar50,JVar58 + uVar50 * 2,0);
        local_1d8 = local_1d8 + (long)local_248->v_samp_factor * 2;
      }
      pjVar48 = cinfo->master;
      p_Var10 = pjVar8[5].decompress_data;
      lVar26 = lVar61;
      if (pjVar48->last_good_iMCU_row < cinfo->output_iMCU_row) {
        lVar26 = (long)(int)lVar61 + (long)cinfo->num_components;
      }
      if (((((*(int *)(p_Var10 + lVar26 * 0x28 + 4) == -1) &&
            (*(int *)(p_Var10 + lVar26 * 0x28 + 8) == -1)) &&
           (*(int *)(p_Var10 + lVar26 * 0x28 + 0xc) == -1)) &&
          ((*(int *)(p_Var10 + lVar26 * 0x28 + 0x10) == -1 &&
           (*(int *)(p_Var10 + lVar26 * 0x28 + 0x14) == -1)))) &&
         ((*(int *)(p_Var10 + lVar26 * 0x28 + 0x18) == -1 &&
          ((*(int *)(p_Var10 + lVar26 * 0x28 + 0x1c) == -1 &&
           (*(int *)(p_Var10 + lVar26 * 0x28 + 0x20) == -1)))))) {
        bVar75 = *(int *)(p_Var10 + lVar26 * 0x28 + 0x24) == -1;
      }
      else {
        bVar75 = false;
      }
      pJVar11 = local_248->quant_table;
      uVar66 = (ulong)pJVar11->quantval[0];
      uVar1 = pJVar11->quantval[1];
      uVar2 = pJVar11->quantval[8];
      uVar3 = pJVar11->quantval[0x10];
      uVar4 = pJVar11->quantval[9];
      uVar5 = pJVar11->quantval[2];
      if (bVar75) {
        local_140 = (ulong)pJVar11->quantval[3];
        local_148 = (ulong)pJVar11->quantval[10];
        local_150 = (ulong)pJVar11->quantval[0x11];
        local_158 = (ulong)pJVar11->quantval[0x18];
      }
      p_Var12 = cinfo->idct->inverse_DCT[lVar61];
      uVar51 = (ulong)pJVar11->quantval[0] << 8;
      uVar6 = uVar70;
      if ((int)uVar70 < 1) {
        uVar6 = 0;
      }
      local_170 = output_buf[lVar61];
      for (uVar67 = 0; uVar67 != uVar6; uVar67 = uVar67 + 1) {
        uVar55 = (ulong)pjVar48->first_MCU_col[lVar61];
        paJVar54 = local_1d8[uVar67] + uVar55;
        if (((uVar67 != 0) ||
            (local_1d0 = paJVar54, local_1c8 = paJVar54, cinfo->output_iMCU_row != 0)) &&
           ((local_1c8 = local_1d8[uVar67 - 1] + uVar55, 1 < uVar67 ||
            (local_1d0 = local_1c8, 1 < cinfo->output_iMCU_row)))) {
          local_1d0 = local_1d8[uVar67 - 2] + uVar55;
        }
        if (((long)uVar67 < (long)(int)(uVar70 - 1)) ||
           (local_1c0 = paJVar54, cinfo->output_iMCU_row < uVar44)) {
          local_1c0 = local_1d8[uVar67 + 1] + uVar55;
        }
        if (((long)uVar67 < (long)(int)(uVar70 - 2)) ||
           (paJVar68 = local_1c0, cinfo->output_iMCU_row < uVar46)) {
          paJVar68 = local_1d8[uVar67 + 2] + uVar55;
        }
        iVar73 = (int)(*local_1d0)[0];
        iVar74 = (int)(*local_1c8)[0];
        iVar52 = (int)(*paJVar54)[0];
        iVar64 = (int)(*local_1c0)[0];
        iVar71 = (int)(*paJVar68)[0];
        uVar50 = local_248->width_in_blocks - 1;
        lVar63 = 0;
        JVar58 = 0;
        iVar65 = iVar52;
        local_23c = iVar64;
        iVar59 = iVar73;
        iVar45 = iVar73;
        iVar32 = iVar73;
        iVar42 = iVar74;
        iVar34 = iVar74;
        iVar35 = iVar74;
        local_25c = iVar52;
        iVar37 = iVar52;
        iVar72 = iVar71;
        iVar62 = iVar71;
        iVar39 = iVar71;
        iVar40 = iVar64;
        iVar41 = iVar64;
        while (iVar38 = iVar62, iVar36 = local_25c, iVar33 = iVar42, iVar42 = iVar45,
              iVar45 = iVar59, local_25c = iVar65, uVar69 = (uint)uVar55,
              uVar69 <= pjVar48->last_MCU_col[lVar61]) {
          jcopy_block_row((JBLOCKROW)((long)*paJVar54 + lVar63),output_row,1);
          iVar59 = iVar73;
          iVar57 = iVar74;
          iVar65 = iVar52;
          iVar62 = iVar71;
          iVar56 = iVar64;
          if ((uVar69 == cinfo->master->first_MCU_col[lVar61]) && (uVar69 < uVar50)) {
            iVar59 = (int)*(short *)((long)local_1d0[1] + lVar63);
            iVar57 = (int)*(short *)((long)local_1c8[1] + lVar63);
            iVar65 = (int)*(short *)((long)paJVar54[1] + lVar63);
            iVar56 = (int)*(short *)((long)local_1c0[1] + lVar63);
            iVar62 = (int)*(short *)((long)paJVar68[1] + lVar63);
          }
          uVar55 = (ulong)(uVar69 + 1);
          if (uVar69 + 1 < uVar50) {
            iVar73 = (int)*(short *)((long)local_1d0[2] + lVar63);
            iVar74 = (int)*(short *)((long)local_1c8[2] + lVar63);
            iVar52 = (int)*(short *)((long)paJVar54[2] + lVar63);
            iVar64 = (int)*(short *)((long)local_1c0[2] + lVar63);
            iVar71 = (int)*(short *)((long)paJVar68[2] + lVar63);
          }
          iVar7 = *(int *)(p_Var10 + lVar26 * 0x28 + 4);
          if ((iVar7 != 0) && ((*output_row)[1] == 0)) {
            if (bVar75) {
              iVar47 = ((iVar74 - (iVar35 + iVar37 + local_23c)) + iVar52 + iVar64) * 3 +
                       iVar71 + iVar73 +
                       (iVar59 - (iVar39 + iVar72 + iVar42 + iVar32)) + iVar62 +
                       (iVar36 - iVar65) * 0x26 + (((iVar33 + iVar40) - iVar57) - iVar56) * 0xd;
            }
            else {
              iVar47 = (iVar52 - iVar37) * 7 + (iVar36 - iVar65) * 0x32;
            }
            lVar49 = (long)iVar47 * uVar66;
            if (lVar49 < 0) {
              auVar18._8_8_ = 0;
              auVar18._0_8_ = (ulong)uVar1 * 0x80 - lVar49;
              iVar60 = 1 << ((byte)iVar7 & 0x1f);
              iVar53 = SUB164(auVar18 / (ZEXT216(uVar1) << 8),0);
              iVar47 = iVar60 + -1;
              if (iVar53 < iVar60) {
                iVar47 = iVar53;
              }
              if (iVar7 < 1) {
                iVar47 = iVar53;
              }
              JVar43 = -(short)iVar47;
            }
            else {
              auVar17._8_8_ = 0;
              auVar17._0_8_ = lVar49 + (ulong)uVar1 * 0x80;
              auVar17 = auVar17 / (ZEXT216(uVar1) << 8);
              JVar43 = auVar17._0_2_;
              if (0 < iVar7) {
                iVar53 = 1 << ((byte)iVar7 & 0x1f);
                iVar47 = auVar17._0_4_;
                iVar7 = iVar53 + -1;
                if (iVar47 < iVar53) {
                  iVar7 = iVar47;
                }
                JVar43 = (JCOEF)iVar7;
              }
            }
            (*output_row)[1] = JVar43;
          }
          iVar7 = *(int *)(p_Var10 + lVar26 * 0x28 + 8);
          if ((iVar7 != 0) && ((*output_row)[8] == 0)) {
            if (bVar75) {
              iVar53 = (((local_23c - (iVar35 + iVar32)) + iVar72 + (iVar34 - iVar41) * 0x26 +
                         ((iVar33 + iVar57) - (iVar40 + iVar56)) * 0xd +
                        (((iVar39 + iVar38) - (iVar45 + iVar42 + iVar59)) + iVar62) * 3) - iVar73) -
                       iVar74;
              iVar47 = iVar64 + iVar71;
            }
            else {
              iVar47 = (iVar34 - iVar41) * 0x32;
              iVar53 = (iVar38 - iVar45) * 7;
            }
            lVar49 = (long)(iVar53 + iVar47) * uVar66;
            if (lVar49 < 0) {
              auVar20._8_8_ = 0;
              auVar20._0_8_ = (ulong)uVar2 * 0x80 - lVar49;
              iVar60 = 1 << ((byte)iVar7 & 0x1f);
              iVar53 = SUB164(auVar20 / (ZEXT216(uVar2) << 8),0);
              iVar47 = iVar60 + -1;
              if (iVar53 < iVar60) {
                iVar47 = iVar53;
              }
              if (iVar7 < 1) {
                iVar47 = iVar53;
              }
              JVar43 = -(short)iVar47;
            }
            else {
              auVar19._8_8_ = 0;
              auVar19._0_8_ = lVar49 + (ulong)uVar2 * 0x80;
              auVar19 = auVar19 / (ZEXT216(uVar2) << 8);
              JVar43 = auVar19._0_2_;
              if (0 < iVar7) {
                iVar53 = 1 << ((byte)iVar7 & 0x1f);
                iVar47 = auVar19._0_4_;
                iVar7 = iVar53 + -1;
                if (iVar47 < iVar53) {
                  iVar7 = iVar47;
                }
                JVar43 = (JCOEF)iVar7;
              }
            }
            (*output_row)[8] = JVar43;
          }
          iVar7 = *(int *)(p_Var10 + lVar26 * 0x28 + 0xc);
          if ((iVar7 != 0) && ((*output_row)[0x10] == 0)) {
            if (bVar75) {
              iVar47 = (iVar36 + iVar65) * -5 + iVar38 +
                       local_25c * -0xe + iVar45 + (iVar34 + iVar41) * 7 +
                       (iVar56 + iVar57 + iVar33 + iVar40) * 2;
            }
            else {
              iVar47 = ((iVar34 + iVar41) * 0xd + local_25c * -0x18) - (iVar45 + iVar38);
            }
            lVar49 = (long)iVar47 * uVar66;
            if (lVar49 < 0) {
              auVar22._8_8_ = 0;
              auVar22._0_8_ = (ulong)uVar3 * 0x80 - lVar49;
              iVar60 = 1 << ((byte)iVar7 & 0x1f);
              iVar53 = SUB164(auVar22 / (ZEXT216(uVar3) << 8),0);
              iVar47 = iVar60 + -1;
              if (iVar53 < iVar60) {
                iVar47 = iVar53;
              }
              if (iVar7 < 1) {
                iVar47 = iVar53;
              }
              JVar43 = -(short)iVar47;
            }
            else {
              auVar21._8_8_ = 0;
              auVar21._0_8_ = lVar49 + (ulong)uVar3 * 0x80;
              auVar21 = auVar21 / (ZEXT216(uVar3) << 8);
              JVar43 = auVar21._0_2_;
              if (0 < iVar7) {
                iVar53 = 1 << ((byte)iVar7 & 0x1f);
                iVar47 = auVar21._0_4_;
                iVar7 = iVar53 + -1;
                if (iVar47 < iVar53) {
                  iVar7 = iVar47;
                }
                JVar43 = (JCOEF)iVar7;
              }
            }
            (*output_row)[0x10] = JVar43;
          }
          iVar7 = *(int *)(p_Var10 + lVar26 * 0x28 + 0x10);
          if ((iVar7 != 0) && ((*output_row)[9] == 0)) {
            iVar47 = (iVar33 - (iVar40 + iVar57)) + iVar56;
            if (bVar75) {
              iVar47 = ((iVar72 - iVar32) + iVar73 + iVar47 * 9) - iVar71;
            }
            else {
              iVar47 = ((((local_23c - (iVar35 + iVar42)) + iVar39 + iVar59) - iVar62) + iVar74 +
                       iVar47 * 10) - iVar64;
            }
            lVar49 = (long)iVar47 * uVar66;
            if (lVar49 < 0) {
              auVar24._8_8_ = 0;
              auVar24._0_8_ = (ulong)uVar4 * 0x80 - lVar49;
              iVar60 = 1 << ((byte)iVar7 & 0x1f);
              iVar53 = SUB164(auVar24 / (ZEXT216(uVar4) << 8),0);
              iVar47 = iVar60 + -1;
              if (iVar53 < iVar60) {
                iVar47 = iVar53;
              }
              if (iVar7 < 1) {
                iVar47 = iVar53;
              }
              JVar43 = -(short)iVar47;
            }
            else {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = lVar49 + (ulong)uVar4 * 0x80;
              auVar23 = auVar23 / (ZEXT216(uVar4) << 8);
              JVar43 = auVar23._0_2_;
              if (0 < iVar7) {
                iVar53 = 1 << ((byte)iVar7 & 0x1f);
                iVar47 = auVar23._0_4_;
                iVar7 = iVar53 + -1;
                if (iVar47 < iVar53) {
                  iVar7 = iVar47;
                }
                JVar43 = (JCOEF)iVar7;
              }
            }
            (*output_row)[9] = JVar43;
          }
          iVar7 = *(int *)(p_Var10 + lVar26 * 0x28 + 0x14);
          if ((iVar7 != 0) && ((*output_row)[2] == 0)) {
            if (bVar75) {
              iVar47 = local_25c * -0xe + iVar37 + (iVar34 + iVar41) * -5 + (iVar36 + iVar65) * 7 +
                       (iVar56 + iVar57 + iVar33 + iVar40) * 2 + iVar52;
            }
            else {
              iVar47 = ((iVar36 + iVar65) * 0xd + local_25c * -0x18) - (iVar52 + iVar37);
            }
            lVar49 = (long)iVar47 * uVar66;
            if (lVar49 < 0) {
              auVar25._8_8_ = 0;
              auVar25._0_8_ = (ulong)uVar5 * 0x80 - lVar49;
              iVar60 = 1 << ((byte)iVar7 & 0x1f);
              iVar53 = SUB164(auVar25 / (ZEXT216(uVar5) << 8),0);
              iVar47 = iVar60 + -1;
              if (iVar53 < iVar60) {
                iVar47 = iVar53;
              }
              if (iVar7 < 1) {
                iVar47 = iVar53;
              }
              JVar43 = -(short)iVar47;
            }
            else {
              auVar27._8_4_ = 0;
              auVar27._0_8_ = lVar49 + (ulong)uVar5 * 0x80;
              auVar27 = auVar27 / (ZEXT212(uVar5) << 8);
              JVar43 = auVar27._0_2_;
              if (0 < iVar7) {
                iVar53 = 1 << ((byte)iVar7 & 0x1f);
                iVar47 = auVar27._0_4_;
                iVar7 = iVar53 + -1;
                if (iVar47 < iVar53) {
                  iVar7 = iVar47;
                }
                JVar43 = (JCOEF)iVar7;
              }
            }
            (*output_row)[2] = JVar43;
          }
          if (bVar75) {
            iVar7 = *(int *)(p_Var10 + lVar26 * 0x28 + 0x18);
            if ((iVar7 != 0) && ((*output_row)[3] == 0)) {
              lVar49 = (long)((((iVar33 + iVar40) - iVar57) - iVar56) + (iVar36 - iVar65) * 2) *
                       uVar66;
              if (lVar49 < 0) {
                iVar60 = 1 << ((byte)iVar7 & 0x1f);
                iVar53 = (int)((local_140 * 0x80 - lVar49) / (local_140 << 8));
                iVar47 = iVar60 + -1;
                if (iVar53 < iVar60) {
                  iVar47 = iVar53;
                }
                if (iVar7 < 1) {
                  iVar47 = iVar53;
                }
                JVar43 = -(short)iVar47;
              }
              else {
                auVar13._8_4_ = 0;
                auVar13._0_8_ = local_140 << 8;
                auVar28._8_4_ = 0;
                auVar28._0_8_ = lVar49 + local_140 * 0x80;
                JVar43 = SUB122(auVar28 / auVar13,0);
                if (0 < iVar7) {
                  iVar53 = 1 << ((byte)iVar7 & 0x1f);
                  iVar47 = SUB124(auVar28 / auVar13,0);
                  iVar7 = iVar53 + -1;
                  if (iVar47 < iVar53) {
                    iVar7 = iVar47;
                  }
                  JVar43 = (JCOEF)iVar7;
                }
              }
              (*output_row)[3] = JVar43;
            }
            iVar7 = *(int *)(p_Var10 + lVar26 * 0x28 + 0x1c);
            if ((iVar7 != 0) && ((*output_row)[10] == 0)) {
              lVar49 = (long)(((iVar33 - iVar40) + iVar57 + (iVar41 - iVar34) * 3) - iVar56) *
                       uVar66;
              if (lVar49 < 0) {
                iVar60 = 1 << ((byte)iVar7 & 0x1f);
                iVar53 = (int)((local_148 * 0x80 - lVar49) / (local_148 << 8));
                iVar47 = iVar60 + -1;
                if (iVar53 < iVar60) {
                  iVar47 = iVar53;
                }
                if (iVar7 < 1) {
                  iVar47 = iVar53;
                }
                JVar43 = -(short)iVar47;
              }
              else {
                auVar14._8_4_ = 0;
                auVar14._0_8_ = local_148 << 8;
                auVar29._8_4_ = 0;
                auVar29._0_8_ = lVar49 + local_148 * 0x80;
                JVar43 = SUB122(auVar29 / auVar14,0);
                if (0 < iVar7) {
                  iVar53 = 1 << ((byte)iVar7 & 0x1f);
                  iVar47 = SUB124(auVar29 / auVar14,0);
                  iVar7 = iVar53 + -1;
                  if (iVar47 < iVar53) {
                    iVar7 = iVar47;
                  }
                  JVar43 = (JCOEF)iVar7;
                }
              }
              (*output_row)[10] = JVar43;
            }
            iVar7 = *(int *)(p_Var10 + lVar26 * 0x28 + 0x20);
            if ((iVar7 != 0) && ((*output_row)[0x11] == 0)) {
              lVar49 = (long)((((iVar33 + iVar40) - iVar57) - iVar56) + (iVar65 - iVar36) * 3) *
                       uVar66;
              if (lVar49 < 0) {
                iVar60 = 1 << ((byte)iVar7 & 0x1f);
                iVar53 = (int)((local_150 * 0x80 - lVar49) / (local_150 << 8));
                iVar47 = iVar60 + -1;
                if (iVar53 < iVar60) {
                  iVar47 = iVar53;
                }
                if (iVar7 < 1) {
                  iVar47 = iVar53;
                }
                JVar43 = -(short)iVar47;
              }
              else {
                auVar15._8_4_ = 0;
                auVar15._0_8_ = local_150 << 8;
                auVar30._8_4_ = 0;
                auVar30._0_8_ = lVar49 + local_150 * 0x80;
                JVar43 = SUB122(auVar30 / auVar15,0);
                if (0 < iVar7) {
                  iVar53 = 1 << ((byte)iVar7 & 0x1f);
                  iVar47 = SUB124(auVar30 / auVar15,0);
                  iVar7 = iVar53 + -1;
                  if (iVar47 < iVar53) {
                    iVar7 = iVar47;
                  }
                  JVar43 = (JCOEF)iVar7;
                }
              }
              (*output_row)[0x11] = JVar43;
            }
            iVar7 = *(int *)(p_Var10 + lVar26 * 0x28 + 0x24);
            if ((iVar7 != 0) && ((*output_row)[0x18] == 0)) {
              lVar49 = (long)(((iVar33 - iVar40) + (iVar34 - iVar41) * 2 + iVar57) - iVar56) *
                       uVar66;
              if (lVar49 < 0) {
                iVar60 = 1 << ((byte)iVar7 & 0x1f);
                iVar53 = (int)((local_158 * 0x80 - lVar49) / (local_158 << 8));
                iVar47 = iVar60 + -1;
                if (iVar53 < iVar60) {
                  iVar47 = iVar53;
                }
                if (iVar7 < 1) {
                  iVar47 = iVar53;
                }
                JVar43 = -(short)iVar47;
              }
              else {
                auVar16._8_4_ = 0;
                auVar16._0_8_ = local_158 << 8;
                auVar31._8_4_ = 0;
                auVar31._0_8_ = lVar49 + local_158 * 0x80;
                JVar43 = SUB122(auVar31 / auVar16,0);
                if (0 < iVar7) {
                  iVar53 = 1 << ((byte)iVar7 & 0x1f);
                  iVar47 = SUB124(auVar31 / auVar16,0);
                  iVar7 = iVar53 + -1;
                  if (iVar47 < iVar53) {
                    iVar7 = iVar47;
                  }
                  JVar43 = (JCOEF)iVar7;
                }
              }
              (*output_row)[0x18] = JVar43;
            }
            lVar49 = (long)((((iVar41 + iVar65 + iVar34 + iVar36) * 0x2a + local_25c * 0x98) -
                            ((iVar72 + iVar32 + iVar71 + iVar73) * 2 +
                            (iVar37 + iVar52 + iVar45 + iVar38) * 8)) +
                           ((iVar57 + iVar56 + iVar40 + iVar33) -
                           (iVar42 + iVar59 + iVar62 + iVar35 + local_23c + iVar39 + iVar64 + iVar74
                           )) * 6);
            if ((long)(lVar49 * uVar66) < 0) {
              JVar43 = -(short)(((0x80 - lVar49) * uVar66) / uVar51);
            }
            else {
              JVar43 = (JCOEF)(((lVar49 + 0x80) * uVar66) / uVar51);
            }
            (*output_row)[0] = JVar43;
          }
          (*p_Var12)(cinfo,local_248,(JCOEFPTR)output_row,local_170,JVar58);
          JVar58 = JVar58 + local_248->DCT_scaled_size;
          lVar63 = lVar63 + 0x80;
          local_23c = iVar40;
          iVar32 = iVar42;
          iVar42 = iVar34;
          iVar34 = iVar57;
          iVar35 = iVar33;
          iVar37 = iVar36;
          iVar72 = iVar39;
          iVar39 = iVar38;
          iVar40 = iVar41;
          iVar41 = iVar56;
          pjVar48 = cinfo->master;
        }
        local_170 = local_170 + local_248->DCT_scaled_size;
      }
    }
    local_248 = local_248 + 1;
  }
  uVar44 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar44;
  return 4 - (uint)(uVar44 < cinfo->total_iMCU_rows);
}

Assistant:

METHODDEF(int)
decompress_smooth_data(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num, last_block_column;
  int ci, block_row, block_rows, access_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr, prev_prev_block_row, prev_block_row;
  JBLOCKROW next_block_row, next_next_block_row;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;
  boolean change_dc;
  JCOEF *workspace;
  int *coef_bits;
  JQUANT_TBL *quanttbl;
  JLONG Q00, Q01, Q02, Q03 = 0, Q10, Q11, Q12 = 0, Q20, Q21 = 0, Q30 = 0, num;
  int DC01, DC02, DC03, DC04, DC05, DC06, DC07, DC08, DC09, DC10, DC11, DC12,
      DC13, DC14, DC15, DC16, DC17, DC18, DC19, DC20, DC21, DC22, DC23, DC24,
      DC25;
  int Al, pred;

  /* Keep a local variable to avoid looking it up more than once */
  workspace = coef->workspace;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number <= cinfo->output_scan_number &&
         !cinfo->inputctl->eoi_reached) {
    if (cinfo->input_scan_number == cinfo->output_scan_number) {
      /* If input is working on current scan, we ordinarily want it to
       * have completed the current row.  But if input scan is DC,
       * we want it to keep two rows ahead so that next two block rows' DC
       * values are up to date.
       */
      JDIMENSION delta = (cinfo->Ss == 0) ? 2 : 0;
      if (cinfo->input_iMCU_row > cinfo->output_iMCU_row + delta)
        break;
    }
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (!compptr->component_needed)
      continue;
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row - 1) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 3; /* this and next two iMCU rows */
    } else if (cinfo->output_iMCU_row < last_iMCU_row) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 2; /* this and next iMCU row */
    } else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
      access_rows = block_rows; /* this iMCU row only */
    }
    /* Align the virtual buffer for this component. */
    if (cinfo->output_iMCU_row > 1) {
      access_rows += 2 * compptr->v_samp_factor; /* prior two iMCU rows too */
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (cinfo->output_iMCU_row - 2) * compptr->v_samp_factor,
         (JDIMENSION)access_rows, FALSE);
      buffer += 2 * compptr->v_samp_factor; /* point to current iMCU row */
    } else if (cinfo->output_iMCU_row > 0) {
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (cinfo->output_iMCU_row - 1) * compptr->v_samp_factor,
         (JDIMENSION)access_rows, FALSE);
      buffer += compptr->v_samp_factor; /* point to current iMCU row */
    } else {
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (JDIMENSION)0, (JDIMENSION)access_rows, FALSE);
    }
    /* Fetch component-dependent info.
     * If the current scan is incomplete, then we use the component-dependent
     * info from the previous scan.
     */
    if (cinfo->output_iMCU_row > cinfo->master->last_good_iMCU_row)
      coef_bits =
        coef->coef_bits_latch + ((ci + cinfo->num_components) * SAVED_COEFS);
    else
      coef_bits = coef->coef_bits_latch + (ci * SAVED_COEFS);

    /* We only do DC interpolation if no AC coefficient data is available. */
    change_dc =
      coef_bits[1] == -1 && coef_bits[2] == -1 && coef_bits[3] == -1 &&
      coef_bits[4] == -1 && coef_bits[5] == -1 && coef_bits[6] == -1 &&
      coef_bits[7] == -1 && coef_bits[8] == -1 && coef_bits[9] == -1;

    quanttbl = compptr->quant_table;
    Q00 = quanttbl->quantval[0];
    Q01 = quanttbl->quantval[Q01_POS];
    Q10 = quanttbl->quantval[Q10_POS];
    Q20 = quanttbl->quantval[Q20_POS];
    Q11 = quanttbl->quantval[Q11_POS];
    Q02 = quanttbl->quantval[Q02_POS];
    if (change_dc) {
      Q03 = quanttbl->quantval[Q03_POS];
      Q12 = quanttbl->quantval[Q12_POS];
      Q21 = quanttbl->quantval[Q21_POS];
      Q30 = quanttbl->quantval[Q30_POS];
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row] + cinfo->master->first_MCU_col[ci];

      if (block_row > 0 || cinfo->output_iMCU_row > 0)
        prev_block_row =
          buffer[block_row - 1] + cinfo->master->first_MCU_col[ci];
      else
        prev_block_row = buffer_ptr;

      if (block_row > 1 || cinfo->output_iMCU_row > 1)
        prev_prev_block_row =
          buffer[block_row - 2] + cinfo->master->first_MCU_col[ci];
      else
        prev_prev_block_row = prev_block_row;

      if (block_row < block_rows - 1 || cinfo->output_iMCU_row < last_iMCU_row)
        next_block_row =
          buffer[block_row + 1] + cinfo->master->first_MCU_col[ci];
      else
        next_block_row = buffer_ptr;

      if (block_row < block_rows - 2 ||
          cinfo->output_iMCU_row < last_iMCU_row - 1)
        next_next_block_row =
          buffer[block_row + 2] + cinfo->master->first_MCU_col[ci];
      else
        next_next_block_row = next_block_row;

      /* We fetch the surrounding DC values using a sliding-register approach.
       * Initialize all 25 here so as to do the right thing on narrow pics.
       */
      DC01 = DC02 = DC03 = DC04 = DC05 = (int)prev_prev_block_row[0][0];
      DC06 = DC07 = DC08 = DC09 = DC10 = (int)prev_block_row[0][0];
      DC11 = DC12 = DC13 = DC14 = DC15 = (int)buffer_ptr[0][0];
      DC16 = DC17 = DC18 = DC19 = DC20 = (int)next_block_row[0][0];
      DC21 = DC22 = DC23 = DC24 = DC25 = (int)next_next_block_row[0][0];
      output_col = 0;
      last_block_column = compptr->width_in_blocks - 1;
      for (block_num = cinfo->master->first_MCU_col[ci];
           block_num <= cinfo->master->last_MCU_col[ci]; block_num++) {
        /* Fetch current DCT block into workspace so we can modify it. */
        jcopy_block_row(buffer_ptr, (JBLOCKROW)workspace, (JDIMENSION)1);
        /* Update DC values */
        if (block_num == cinfo->master->first_MCU_col[ci] &&
            block_num < last_block_column) {
          DC04 = (int)prev_prev_block_row[1][0];
          DC09 = (int)prev_block_row[1][0];
          DC14 = (int)buffer_ptr[1][0];
          DC19 = (int)next_block_row[1][0];
          DC24 = (int)next_next_block_row[1][0];
        }
        if (block_num + 1 < last_block_column) {
          DC05 = (int)prev_prev_block_row[2][0];
          DC10 = (int)prev_block_row[2][0];
          DC15 = (int)buffer_ptr[2][0];
          DC20 = (int)next_block_row[2][0];
          DC25 = (int)next_next_block_row[2][0];
        }
        /* If DC interpolation is enabled, compute coefficient estimates using
         * a Gaussian-like kernel, keeping the averages of the DC values.
         *
         * If DC interpolation is disabled, compute coefficient estimates using
         * an algorithm similar to the one described in Section K.8 of the JPEG
         * standard, except applied to a 5x5 window rather than a 3x3 window.
         *
         * An estimate is applied only if the coefficient is still zero and is
         * not known to be fully accurate.
         */
        /* AC01 */
        if ((Al = coef_bits[1]) != 0 && workspace[1] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 - DC02 + DC04 + DC05 - 3 * DC06 + 13 * DC07 -
                 13 * DC09 + 3 * DC10 - 3 * DC11 + 38 * DC12 - 38 * DC14 +
                 3 * DC15 - 3 * DC16 + 13 * DC17 - 13 * DC19 + 3 * DC20 -
                 DC21 - DC22 + DC24 + DC25) :
                (-7 * DC11 + 50 * DC12 - 50 * DC14 + 7 * DC15));
          if (num >= 0) {
            pred = (int)(((Q01 << 7) + num) / (Q01 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q01 << 7) - num) / (Q01 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[1] = (JCOEF)pred;
        }
        /* AC10 */
        if ((Al = coef_bits[2]) != 0 && workspace[8] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 - 3 * DC02 - 3 * DC03 - 3 * DC04 - DC05 - DC06 +
                 13 * DC07 + 38 * DC08 + 13 * DC09 - DC10 + DC16 -
                 13 * DC17 - 38 * DC18 - 13 * DC19 + DC20 + DC21 +
                 3 * DC22 + 3 * DC23 + 3 * DC24 + DC25) :
                (-7 * DC03 + 50 * DC08 - 50 * DC18 + 7 * DC23));
          if (num >= 0) {
            pred = (int)(((Q10 << 7) + num) / (Q10 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q10 << 7) - num) / (Q10 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[8] = (JCOEF)pred;
        }
        /* AC20 */
        if ((Al = coef_bits[3]) != 0 && workspace[16] == 0) {
          num = Q00 * (change_dc ?
                (DC03 + 2 * DC07 + 7 * DC08 + 2 * DC09 - 5 * DC12 - 14 * DC13 -
                 5 * DC14 + 2 * DC17 + 7 * DC18 + 2 * DC19 + DC23) :
                (-DC03 + 13 * DC08 - 24 * DC13 + 13 * DC18 - DC23));
          if (num >= 0) {
            pred = (int)(((Q20 << 7) + num) / (Q20 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q20 << 7) - num) / (Q20 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[16] = (JCOEF)pred;
        }
        /* AC11 */
        if ((Al = coef_bits[4]) != 0 && workspace[9] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 + DC05 + 9 * DC07 - 9 * DC09 - 9 * DC17 +
                 9 * DC19 + DC21 - DC25) :
                (DC10 + DC16 - 10 * DC17 + 10 * DC19 - DC02 - DC20 + DC22 -
                 DC24 + DC04 - DC06 + 10 * DC07 - 10 * DC09));
          if (num >= 0) {
            pred = (int)(((Q11 << 7) + num) / (Q11 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q11 << 7) - num) / (Q11 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[9] = (JCOEF)pred;
        }
        /* AC02 */
        if ((Al = coef_bits[5]) != 0 && workspace[2] == 0) {
          num = Q00 * (change_dc ?
                (2 * DC07 - 5 * DC08 + 2 * DC09 + DC11 + 7 * DC12 - 14 * DC13 +
                 7 * DC14 + DC15 + 2 * DC17 - 5 * DC18 + 2 * DC19) :
                (-DC11 + 13 * DC12 - 24 * DC13 + 13 * DC14 - DC15));
          if (num >= 0) {
            pred = (int)(((Q02 << 7) + num) / (Q02 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q02 << 7) - num) / (Q02 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[2] = (JCOEF)pred;
        }
        if (change_dc) {
          /* AC03 */
          if ((Al = coef_bits[6]) != 0 && workspace[3] == 0) {
            num = Q00 * (DC07 - DC09 + 2 * DC12 - 2 * DC14 + DC17 - DC19);
            if (num >= 0) {
              pred = (int)(((Q03 << 7) + num) / (Q03 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q03 << 7) - num) / (Q03 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[3] = (JCOEF)pred;
          }
          /* AC12 */
          if ((Al = coef_bits[7]) != 0 && workspace[10] == 0) {
            num = Q00 * (DC07 - 3 * DC08 + DC09 - DC17 + 3 * DC18 - DC19);
            if (num >= 0) {
              pred = (int)(((Q12 << 7) + num) / (Q12 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q12 << 7) - num) / (Q12 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[10] = (JCOEF)pred;
          }
          /* AC21 */
          if ((Al = coef_bits[8]) != 0 && workspace[17] == 0) {
            num = Q00 * (DC07 - DC09 - 3 * DC12 + 3 * DC14 + DC17 - DC19);
            if (num >= 0) {
              pred = (int)(((Q21 << 7) + num) / (Q21 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q21 << 7) - num) / (Q21 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[17] = (JCOEF)pred;
          }
          /* AC30 */
          if ((Al = coef_bits[9]) != 0 && workspace[24] == 0) {
            num = Q00 * (DC07 + 2 * DC08 + DC09 - DC17 - 2 * DC18 - DC19);
            if (num >= 0) {
              pred = (int)(((Q30 << 7) + num) / (Q30 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q30 << 7) - num) / (Q30 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[24] = (JCOEF)pred;
          }
          /* coef_bits[0] is non-negative.  Otherwise this function would not
           * be called.
           */
          num = Q00 *
                (-2 * DC01 - 6 * DC02 - 8 * DC03 - 6 * DC04 - 2 * DC05 -
                 6 * DC06 + 6 * DC07 + 42 * DC08 + 6 * DC09 - 6 * DC10 -
                 8 * DC11 + 42 * DC12 + 152 * DC13 + 42 * DC14 - 8 * DC15 -
                 6 * DC16 + 6 * DC17 + 42 * DC18 + 6 * DC19 - 6 * DC20 -
                 2 * DC21 - 6 * DC22 - 8 * DC23 - 6 * DC24 - 2 * DC25);
          if (num >= 0) {
            pred = (int)(((Q00 << 7) + num) / (Q00 << 8));
          } else {
            pred = (int)(((Q00 << 7) - num) / (Q00 << 8));
            pred = -pred;
          }
          workspace[0] = (JCOEF)pred;
        }  /* change_dc */

        /* OK, do the IDCT */
        (*inverse_DCT) (cinfo, compptr, (JCOEFPTR)workspace, output_ptr,
                        output_col);
        /* Advance for next column */
        DC01 = DC02;  DC02 = DC03;  DC03 = DC04;  DC04 = DC05;
        DC06 = DC07;  DC07 = DC08;  DC08 = DC09;  DC09 = DC10;
        DC11 = DC12;  DC12 = DC13;  DC13 = DC14;  DC14 = DC15;
        DC16 = DC17;  DC17 = DC18;  DC18 = DC19;  DC19 = DC20;
        DC21 = DC22;  DC22 = DC23;  DC23 = DC24;  DC24 = DC25;
        buffer_ptr++, prev_block_row++, next_block_row++,
          prev_prev_block_row++, next_next_block_row++;
        output_col += compptr->_DCT_scaled_size;
      }
      output_ptr += compptr->_DCT_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}